

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

FString __thiscall FString::Mid(FString *this,size_t pos,size_t numChars)

{
  size_t sVar1;
  size_t in_RCX;
  size_t len;
  size_t numChars_local;
  size_t pos_local;
  FString *this_local;
  
  sVar1 = Len((FString *)pos);
  if (numChars < sVar1) {
    if ((sVar1 < numChars + in_RCX) || (len = in_RCX, numChars + in_RCX < numChars)) {
      len = sVar1 - numChars;
    }
    FString(this,(char *)(*(long *)pos + numChars),len);
  }
  else {
    FString(this);
  }
  return (FString)(char *)this;
}

Assistant:

FString FString::Mid (size_t pos, size_t numChars) const
{
	size_t len = Len();
	if (pos >= len)
	{
		return FString();
	}
	if (pos + numChars > len || pos + numChars < pos)
	{
		numChars = len - pos;
	}
	return FString (Chars + pos, numChars);
}